

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall
kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Callbacks>::
rehash(HashIndex<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Callbacks>
       *this,size_t targetSize)

{
  size_t in_R8;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  Array<kj::_::HashBucket> AStack_28;
  
  oldBuckets.size_ = targetSize;
  oldBuckets.ptr = (HashBucket *)(this->buckets).size_;
  kj::_::rehash(&AStack_28,(_ *)(this->buckets).ptr,oldBuckets,in_R8);
  Array<kj::_::HashBucket>::operator=(&this->buckets,&AStack_28);
  Array<kj::_::HashBucket>::~Array(&AStack_28);
  return;
}

Assistant:

void rehash(size_t targetSize) {
    buckets = _::rehash(buckets, targetSize);
  }